

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::Unparser::unparseParams
          (Unparser *this,Fodder *fodder_l,ArgParams *params,bool trailing_comma,Fodder *fodder_r)

{
  pointer pAVar1;
  ostream *poVar2;
  bool bVar3;
  Fodder *fodder;
  pointer pAVar4;
  string local_50;
  
  fodder_fill(this->o,fodder_l,false,false,false);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"(",1);
  pAVar4 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (params->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar4 != pAVar1) {
    bVar3 = true;
    fodder = &pAVar4->commaFodder;
    do {
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
      fodder_fill(this->o,(Fodder *)((long)(fodder + -3) + 8),(bool)(~bVar3 & 1),true,false);
      poVar2 = this->o;
      unparse_id_abi_cxx11_
                (&local_50,(internal *)**(undefined8 **)((long)(fodder + -2) + 8),
                 (Identifier *)(*(undefined8 **)((long)(fodder + -2) + 8))[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)((long)(fodder + -1) + 0x10) != 0) {
        fodder_fill(this->o,(Fodder *)((long)(fodder + -2) + 0x10),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"=",1);
        unparse(this,*(AST **)((long)(fodder + -1) + 0x10),false);
      }
      bVar3 = false;
      fodder_fill(this->o,fodder,false,false,false);
      pAVar4 = (pointer)(fodder + 1);
      fodder = (Fodder *)((long)(fodder + 3) + 0x10);
    } while (pAVar4 != pAVar1);
  }
  if (trailing_comma) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
  }
  fodder_fill(this->o,fodder_r,false,false,false);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
  return;
}

Assistant:

void unparseParams(const Fodder &fodder_l, const ArgParams &params, bool trailing_comma,
                       const Fodder &fodder_r)
    {
        fill(fodder_l, false, false);
        o << "(";
        bool first = true;
        for (const auto &param : params) {
            if (!first)
                o << ",";
            fill(param.idFodder, !first, true);
            o << unparse_id(param.id);
            if (param.expr != nullptr) {
                // default arg, no spacing: x=e
                fill(param.eqFodder, false, false);
                o << "=";
                unparse(param.expr, false);
            }
            fill(param.commaFodder, false, false);
            first = false;
        }
        if (trailing_comma)
            o << ",";
        fill(fodder_r, false, false);
        o << ")";
    }